

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void kj::AsyncObject::failed(void)

{
  char *pcVar1;
  size_t sVar2;
  StringPtr *in_RCX;
  long in_FS_OFFSET;
  Fault f;
  Fault local_30;
  String local_28;
  
  str<char_const(&)[51],kj::StringPtr&>
            (&local_28,(kj *)"KJ async object being destroyed when not allowed: ",
             *(char (**) [51])(in_FS_OFFSET + -0x28),in_RCX);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::String>
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x8e,FAILED,(char *)0x0,
             "kj::str(\"KJ async object being destroyed when not allowed: \", disallowAsyncDestructorsScope->reason)"
             ,&local_28);
  sVar2 = local_28.content.size_;
  pcVar1 = local_28.content.ptr;
  if (local_28.content.ptr != (char *)0x0) {
    local_28.content.ptr = (char *)0x0;
    local_28.content.size_ = 0;
    (*(code *)**(undefined8 **)local_28.content.disposer)
              (local_28.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

void AsyncObject::failed() noexcept {
  // Since the method is noexcept, this will abort the process.
  KJ_FAIL_REQUIRE(
      kj::str("KJ async object being destroyed when not allowed: ",
              disallowAsyncDestructorsScope->reason));
}